

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall sf::Window::initialize(Window *this)

{
  bool bVar1;
  
  bVar1 = setActive(this,true);
  if (bVar1) {
    (*this->m_context->_vptr_GlContext[3])(this->m_context,0);
  }
  (this->m_frameTimeLimit).m_microseconds = 0;
  Clock::restart(&this->m_clock);
  setActive(this,true);
  WindowBase::initialize(&this->super_WindowBase);
  return;
}

Assistant:

void Window::initialize()
{
    // Setup default behaviors (to get a consistent behavior across different implementations)
    setVerticalSyncEnabled(false);
    setFramerateLimit(0);

    // Reset frame time
    m_clock.restart();

    // Activate the window
    setActive();

    WindowBase::initialize();
}